

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

FT_Error ft_var_load_item_variation_store(TT_Face face,FT_ULong offset,GX_ItemVarStore itemStore)

{
  FT_Stream stream;
  FT_Memory memory;
  GX_Blend pGVar1;
  FT_Char FVar2;
  FT_UShort FVar3;
  FT_UShort FVar4;
  FT_UShort FVar5;
  uint uVar6;
  FT_ULong FVar7;
  FT_Pointer P;
  FT_ULong FVar8;
  GX_VarRegion pGVar9;
  GX_AxisCoords pGVar10;
  GX_ItemVarData pGVar11;
  FT_UInt *pFVar12;
  FT_Short *pFVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  FT_Fixed *local_48;
  FT_Error local_34 [2];
  FT_Error error;
  
  stream = (face->root).stream;
  memory = stream->memory;
  pGVar1 = face->blend;
  local_34[0] = FT_Stream_Seek(stream,offset);
  if (local_34[0] == 0) {
    FVar3 = FT_Stream_ReadUShort(stream,local_34);
    if (local_34[0] == 0) {
      if (FVar3 == 1) {
        FVar7 = FT_Stream_ReadULong(stream,local_34);
        if (local_34[0] == 0) {
          FVar3 = FT_Stream_ReadUShort(stream,local_34);
          itemStore->dataCount = (uint)FVar3;
          if (local_34[0] == 0) {
            if (FVar3 != 0) {
              P = ft_mem_realloc(memory,8,0,(ulong)FVar3,(void *)0x0,local_34);
              if (local_34[0] == 0) {
                uVar14 = 0;
                do {
                  if (itemStore->dataCount <= uVar14) {
                    local_34[0] = FT_Stream_Seek(stream,FVar7 + offset);
                    if (local_34[0] == 0) {
                      FVar3 = FT_Stream_ReadUShort(stream,local_34);
                      itemStore->axisCount = FVar3;
                      if (local_34[0] == 0) {
                        FVar3 = FT_Stream_ReadUShort(stream,local_34);
                        itemStore->regionCount = (uint)FVar3;
                        if (local_34[0] == 0) {
                          if (pGVar1->mmvar->num_axis == (uint)itemStore->axisCount) {
                            pGVar9 = (GX_VarRegion)
                                     ft_mem_realloc(memory,8,0,(ulong)FVar3,(void *)0x0,local_34);
                            itemStore->varRegionList = pGVar9;
                            if (local_34[0] == 0) {
                              local_58 = 0;
                              goto LAB_00223f19;
                            }
                          }
                          else {
                            local_34[0] = 8;
                          }
                        }
                      }
                    }
                    break;
                  }
                  FVar8 = FT_Stream_ReadULong(stream,local_34);
                  *(FT_ULong *)((long)P + uVar14 * 8) = FVar8;
                  uVar14 = uVar14 + 1;
                } while (local_34[0] == 0);
              }
              goto LAB_00223e64;
            }
            goto LAB_00223e5a;
          }
        }
      }
      else {
LAB_00223e5a:
        local_34[0] = 8;
      }
    }
  }
  P = (void *)0x0;
LAB_00223e64:
  ft_mem_free(memory,P);
  return local_34[0];
LAB_00223f19:
  if (itemStore->regionCount <= local_58) goto LAB_00224013;
  pGVar10 = (GX_AxisCoords)
            ft_mem_realloc(memory,0x18,0,(ulong)itemStore->axisCount,(void *)0x0,local_34);
  itemStore->varRegionList[local_58].axisList = pGVar10;
  if (local_34[0] != 0) goto LAB_00223e64;
  local_48 = &pGVar10->endCoord;
  for (uVar14 = 0; uVar14 < itemStore->axisCount; uVar14 = uVar14 + 1) {
    FVar3 = FT_Stream_ReadUShort(stream,local_34);
    if (((local_34[0] != 0) || (FVar4 = FT_Stream_ReadUShort(stream,local_34), local_34[0] != 0)) ||
       (FVar5 = FT_Stream_ReadUShort(stream,local_34), local_34[0] != 0)) goto LAB_00223e64;
    ((GX_AxisCoordsRec_ *)(local_48 + -2))->startCoord = (long)(short)FVar3 << 2;
    local_48[-1] = (long)(short)FVar4 << 2;
    *local_48 = (long)(short)FVar5 << 2;
    local_48 = local_48 + 3;
  }
  local_58 = local_58 + 1;
  goto LAB_00223f19;
LAB_00224013:
  pGVar11 = (GX_ItemVarData)
            ft_mem_realloc(memory,0x18,0,(ulong)itemStore->dataCount,(void *)0x0,local_34);
  itemStore->varData = pGVar11;
  if (local_34[0] == 0) {
    for (local_68 = 0; local_68 < itemStore->dataCount; local_68 = local_68 + 1) {
      pGVar11 = itemStore->varData + local_68;
      local_34[0] = FT_Stream_Seek(stream,*(long *)((long)P + local_68 * 8) + offset);
      if (local_34[0] != 0) break;
      FVar3 = FT_Stream_ReadUShort(stream,local_34);
      pGVar11->itemCount = (uint)FVar3;
      if ((local_34[0] != 0) || (FVar3 = FT_Stream_ReadUShort(stream,local_34), local_34[0] != 0))
      break;
      FVar4 = FT_Stream_ReadUShort(stream,local_34);
      pGVar11->regionIdxCount = (uint)FVar4;
      if (local_34[0] != 0) break;
      if ((FVar4 < FVar3) || (itemStore->regionCount < (uint)FVar4)) {
LAB_00224241:
        local_34[0] = 8;
        break;
      }
      pFVar12 = (FT_UInt *)ft_mem_realloc(memory,4,0,(ulong)FVar4,(void *)0x0,local_34);
      pGVar11->regionIndices = pFVar12;
      if (local_34[0] != 0) break;
      uVar14 = 0;
      while (uVar14 < pGVar11->regionIdxCount) {
        FVar4 = FT_Stream_ReadUShort(stream,local_34);
        pGVar11->regionIndices[uVar14] = (uint)FVar4;
        if (local_34[0] != 0) goto LAB_00223e64;
        uVar14 = uVar14 + 1;
        if (itemStore->regionCount < (uint)FVar4 || itemStore->regionCount == (uint)FVar4)
        goto LAB_00224241;
      }
      pFVar13 = (FT_Short *)
                ft_mem_realloc(memory,2,0,(ulong)(pGVar11->regionIdxCount * pGVar11->itemCount),
                               (void *)0x0,local_34);
      pGVar11->deltaSet = pFVar13;
      if (local_34[0] != 0) break;
      uVar6 = pGVar11->regionIdxCount;
      local_60 = 0;
      while (uVar14 = local_60, uVar15 = (uint)FVar3, (uint)local_60 < uVar6 * pGVar11->itemCount) {
        while (uVar16 = (uint)FVar3, uVar15 != 0) {
          FVar4 = FT_Stream_ReadUShort(stream,local_34);
          if (local_34[0] != 0) goto LAB_00223e64;
          pGVar11->deltaSet[uVar14] = FVar4;
          uVar14 = (ulong)((int)uVar14 + 1);
          uVar15 = uVar15 - 1;
        }
        while( true ) {
          uVar6 = pGVar11->regionIdxCount;
          if (uVar6 <= uVar16) break;
          FVar2 = FT_Stream_ReadChar(stream,local_34);
          if (local_34[0] != 0) goto LAB_00223e64;
          pGVar11->deltaSet[(uint)local_60 + uVar16] = (short)FVar2;
          uVar16 = uVar16 + 1;
        }
        local_60 = (ulong)((uint)local_60 + uVar16);
      }
    }
  }
  goto LAB_00223e64;
}

Assistant:

static FT_Error
  ft_var_load_item_variation_store( TT_Face          face,
                                    FT_ULong         offset,
                                    GX_ItemVarStore  itemStore )
  {
    FT_Stream  stream = FT_FACE_STREAM( face );
    FT_Memory  memory = stream->memory;

    FT_Error   error;
    FT_UShort  format;
    FT_ULong   region_offset;
    FT_UInt    i, j, k;
    FT_UInt    shortDeltaCount;

    GX_Blend        blend = face->blend;
    GX_ItemVarData  varData;

    FT_ULong*  dataOffsetArray = NULL;


    if ( FT_STREAM_SEEK( offset ) ||
         FT_READ_USHORT( format ) )
      goto Exit;

    if ( format != 1 )
    {
      FT_TRACE2(( "ft_var_load_item_variation_store: bad store format %d\n",
                  format ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    /* read top level fields */
    if ( FT_READ_ULONG( region_offset )         ||
         FT_READ_USHORT( itemStore->dataCount ) )
      goto Exit;

    /* we need at least one entry in `itemStore->varData' */
    if ( !itemStore->dataCount )
    {
      FT_TRACE2(( "ft_var_load_item_variation_store: missing varData\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    /* make temporary copy of item variation data offsets; */
    /* we will parse region list first, then come back     */
    if ( FT_NEW_ARRAY( dataOffsetArray, itemStore->dataCount ) )
      goto Exit;

    for ( i = 0; i < itemStore->dataCount; i++ )
    {
      if ( FT_READ_ULONG( dataOffsetArray[i] ) )
        goto Exit;
    }

    /* parse array of region records (region list) */
    if ( FT_STREAM_SEEK( offset + region_offset ) )
      goto Exit;

    if ( FT_READ_USHORT( itemStore->axisCount )   ||
         FT_READ_USHORT( itemStore->regionCount ) )
      goto Exit;

    if ( itemStore->axisCount != (FT_Long)blend->mmvar->num_axis )
    {
      FT_TRACE2(( "ft_var_load_item_variation_store:"
                  " number of axes in item variation store\n"
                  "                                 "
                  " and `fvar' table are different\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    if ( FT_NEW_ARRAY( itemStore->varRegionList, itemStore->regionCount ) )
      goto Exit;

    for ( i = 0; i < itemStore->regionCount; i++ )
    {
      GX_AxisCoords  axisCoords;


      if ( FT_NEW_ARRAY( itemStore->varRegionList[i].axisList,
                         itemStore->axisCount ) )
        goto Exit;

      axisCoords = itemStore->varRegionList[i].axisList;

      for ( j = 0; j < itemStore->axisCount; j++ )
      {
        FT_Short  start, peak, end;


        if ( FT_READ_SHORT( start ) ||
             FT_READ_SHORT( peak )  ||
             FT_READ_SHORT( end )   )
          goto Exit;

        axisCoords[j].startCoord = FT_fdot14ToFixed( start );
        axisCoords[j].peakCoord  = FT_fdot14ToFixed( peak );
        axisCoords[j].endCoord   = FT_fdot14ToFixed( end );
      }
    }

    /* end of region list parse */

    /* use dataOffsetArray now to parse varData items */
    if ( FT_NEW_ARRAY( itemStore->varData, itemStore->dataCount ) )
      goto Exit;

    for ( i = 0; i < itemStore->dataCount; i++ )
    {
      varData = &itemStore->varData[i];

      if ( FT_STREAM_SEEK( offset + dataOffsetArray[i] ) )
        goto Exit;

      if ( FT_READ_USHORT( varData->itemCount )      ||
           FT_READ_USHORT( shortDeltaCount )         ||
           FT_READ_USHORT( varData->regionIdxCount ) )
        goto Exit;

      /* check some data consistency */
      if ( shortDeltaCount > varData->regionIdxCount )
      {
        FT_TRACE2(( "bad short count %d or region count %d\n",
                    shortDeltaCount,
                    varData->regionIdxCount ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      if ( varData->regionIdxCount > itemStore->regionCount )
      {
        FT_TRACE2(( "inconsistent regionCount %d in varData[%d]\n",
                    varData->regionIdxCount,
                    i ));
        error = FT_THROW( Invalid_Table );
        goto Exit;
      }

      /* parse region indices */
      if ( FT_NEW_ARRAY( varData->regionIndices,
                         varData->regionIdxCount ) )
        goto Exit;

      for ( j = 0; j < varData->regionIdxCount; j++ )
      {
        if ( FT_READ_USHORT( varData->regionIndices[j] ) )
          goto Exit;

        if ( varData->regionIndices[j] >= itemStore->regionCount )
        {
          FT_TRACE2(( "bad region index %d\n",
                      varData->regionIndices[j] ));
          error = FT_THROW( Invalid_Table );
          goto Exit;
        }
      }

      /* Parse delta set.                                                */
      /*                                                                 */
      /* On input, deltas are (shortDeltaCount + regionIdxCount) bytes   */
      /* each; on output, deltas are expanded to `regionIdxCount' shorts */
      /* each.                                                           */
      if ( FT_NEW_ARRAY( varData->deltaSet,
                         varData->regionIdxCount * varData->itemCount ) )
        goto Exit;

      /* the delta set is stored as a 2-dimensional array of shorts; */
      /* sign-extend signed bytes to signed shorts                   */
      for ( j = 0; j < varData->itemCount * varData->regionIdxCount; )
      {
        for ( k = 0; k < shortDeltaCount; k++, j++ )
        {
          /* read the short deltas */
          FT_Short  delta;


          if ( FT_READ_SHORT( delta ) )
            goto Exit;

          varData->deltaSet[j] = delta;
        }

        for ( ; k < varData->regionIdxCount; k++, j++ )
        {
          /* read the (signed) byte deltas */
          FT_Char  delta;


          if ( FT_READ_CHAR( delta ) )
            goto Exit;

          varData->deltaSet[j] = delta;
        }
      }
    }

  Exit:
    FT_FREE( dataOffsetArray );

    return error;
  }